

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_resolv_check(Curl_easy *data,Curl_dns_entry **dns)

{
  CURLcode local_1c;
  CURLcode result;
  Curl_dns_entry **dns_local;
  Curl_easy *data_local;
  
  if (((ulong)data->conn->bits >> 0x19 & 1) == 0) {
    local_1c = Curl_resolver_is_resolved(data,dns);
  }
  else {
    local_1c = Curl_doh_is_resolved(data,dns);
  }
  if (*dns != (Curl_dns_entry *)0x0) {
    show_resolve_info(data,*dns);
  }
  return local_1c;
}

Assistant:

CURLcode Curl_resolv_check(struct Curl_easy *data,
                           struct Curl_dns_entry **dns)
{
  CURLcode result;
#if defined(CURL_DISABLE_DOH) && !defined(CURLRES_ASYNCH)
  (void)data;
  (void)dns;
#endif
#ifndef CURL_DISABLE_DOH
  if(data->conn->bits.doh) {
    result = Curl_doh_is_resolved(data, dns);
  }
  else
#endif
  result = Curl_resolver_is_resolved(data, dns);
  if(*dns)
    show_resolve_info(data, *dns);
  return result;
}